

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_bool_expr.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformBoolExpr(Transformer *this,PGBoolExpr *root)

{
  int iVar1;
  long lVar2;
  optional_ptr<duckdb::Transformer,_true> oVar3;
  ExpressionType EVar4;
  pointer pPVar5;
  pointer pPVar6;
  Transformer *this_00;
  type expr;
  long in_RDX;
  pointer *__ptr_2;
  pointer *__ptr;
  Transformer *pTVar7;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> next;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> local_48
  ;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_40;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_38;
  
  (this->parent).ptr = (Transformer *)0x0;
  lVar2 = *(long *)(*(long *)(in_RDX + 8) + 8);
  do {
    if (lVar2 == 0) {
      expr = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          *)this);
      SetQueryLocation(expr,*(int *)(in_RDX + 0x10));
      return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
             this;
    }
    TransformExpression((Transformer *)&stack0xffffffffffffffb8,
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    oVar3.ptr = (Transformer *)
                local_48._M_t.
                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    iVar1 = *(int *)(in_RDX + 4);
    if (iVar1 == 0) {
      if ((this->parent).ptr != (Transformer *)0x0) {
        this_00 = (Transformer *)operator_new(0x50);
        local_38._M_head_impl = (ParsedExpression *)(this->parent).ptr;
        (this->parent).ptr = (Transformer *)0x0;
        local_40._M_head_impl =
             (ParsedExpression *)
             local_48._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        local_48._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
             (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
              )0x0;
        ConjunctionExpression::ConjunctionExpression
                  ((ConjunctionExpression *)this_00,CONJUNCTION_AND,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&stack0xffffffffffffffc8,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&stack0xffffffffffffffc0);
        goto LAB_00e92177;
      }
LAB_00e920ea:
      local_48._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
           (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            )0x0;
      (this->parent).ptr = oVar3.ptr;
    }
    else {
      if (iVar1 == 1) {
        if ((this->parent).ptr == (Transformer *)0x0) goto LAB_00e920ea;
        this_00 = (Transformer *)operator_new(0x50);
        local_38._M_head_impl = (ParsedExpression *)(this->parent).ptr;
        (this->parent).ptr = (Transformer *)0x0;
        local_40._M_head_impl =
             (ParsedExpression *)
             local_48._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        local_48._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
             (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
              )0x0;
        ConjunctionExpression::ConjunctionExpression
                  ((ConjunctionExpression *)this_00,CONJUNCTION_OR,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&stack0xffffffffffffffc8,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&stack0xffffffffffffffc0);
LAB_00e92177:
        if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)local_40._M_head_impl !=
            (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
          (*(code *)((Transformer *)
                    ((local_40._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->options)
                    ();
        }
        local_40._M_head_impl = (ParsedExpression *)0x0;
        if (local_38._M_head_impl != (ParsedExpression *)0x0) {
          (**(code **)(*(long *)local_38._M_head_impl + 8))();
        }
        pTVar7 = (this->parent).ptr;
        (this->parent).ptr = this_00;
      }
      else {
        if (iVar1 != 2) goto LAB_00e921b1;
        pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)&stack0xffffffffffffffb8);
        if ((pPVar5->super_BaseExpression).type == COMPARE_IN) {
          pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                 *)&stack0xffffffffffffffb8);
          (pPVar5->super_BaseExpression).type = COMPARE_NOT_IN;
        }
        else {
          pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                 *)&stack0xffffffffffffffb8);
          if (((pPVar5->super_BaseExpression).type < COMPARE_BOUNDARY_START) ||
             (pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                     *)&stack0xffffffffffffffb8),
             COMPARE_GREATERTHANOREQUALTO < (pPVar5->super_BaseExpression).type)) {
            this_00 = (Transformer *)operator_new(0x50);
            local_38._M_head_impl =
                 (ParsedExpression *)
                 local_48._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            local_48._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
                 (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                  )0x0;
            local_40._M_head_impl = (ParsedExpression *)0x0;
            OperatorExpression::OperatorExpression
                      ((OperatorExpression *)this_00,OPERATOR_NOT,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&stack0xffffffffffffffc8,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&stack0xffffffffffffffc0);
            goto LAB_00e92177;
          }
          pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                 *)&stack0xffffffffffffffb8);
          pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                 *)&stack0xffffffffffffffb8);
          EVar4 = NegateComparisonExpression((pPVar6->super_BaseExpression).type);
          (pPVar5->super_BaseExpression).type = EVar4;
        }
        oVar3.ptr = (Transformer *)
                    local_48._M_t.
                    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        local_48._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
             (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
              )0x0;
        pTVar7 = (this->parent).ptr;
        (this->parent).ptr = oVar3.ptr;
      }
      if (pTVar7 != (Transformer *)0x0) {
        (*(code *)((pTVar7->parent).ptr)->options)();
      }
    }
LAB_00e921b1:
    if (local_48._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         )0x0) {
      (*(code *)((((Transformer *)
                  local_48._M_t.
                  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->parent).
                ptr)->options)();
    }
    lVar2 = *(long *)(lVar2 + 8);
  } while( true );
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformBoolExpr(duckdb_libpgquery::PGBoolExpr &root) {
	unique_ptr<ParsedExpression> result;
	for (auto node = root.args->head; node != nullptr; node = node->next) {
		auto next = TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(node->data.ptr_value));

		switch (root.boolop) {
		case duckdb_libpgquery::PG_AND_EXPR: {
			if (!result) {
				result = std::move(next);
			} else {
				result = make_uniq<ConjunctionExpression>(ExpressionType::CONJUNCTION_AND, std::move(result),
				                                          std::move(next));
			}
			break;
		}
		case duckdb_libpgquery::PG_OR_EXPR: {
			if (!result) {
				result = std::move(next);
			} else {
				result = make_uniq<ConjunctionExpression>(ExpressionType::CONJUNCTION_OR, std::move(result),
				                                          std::move(next));
			}
			break;
		}
		case duckdb_libpgquery::PG_NOT_EXPR: {
			if (next->GetExpressionType() == ExpressionType::COMPARE_IN) {
				// convert COMPARE_IN to COMPARE_NOT_IN
				next->SetExpressionTypeUnsafe(ExpressionType::COMPARE_NOT_IN);
				result = std::move(next);
			} else if (next->GetExpressionType() >= ExpressionType::COMPARE_EQUAL &&
			           next->GetExpressionType() <= ExpressionType::COMPARE_GREATERTHANOREQUALTO) {
				// NOT on a comparison: we can negate the comparison
				// e.g. NOT(x > y) is equivalent to x <= y
				next->SetExpressionTypeUnsafe(NegateComparisonExpression(next->GetExpressionType()));
				result = std::move(next);
			} else {
				result = make_uniq<OperatorExpression>(ExpressionType::OPERATOR_NOT, std::move(next));
			}
			break;
		}
		}
	}
	SetQueryLocation(*result, root.location);
	return result;
}